

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O2

Maybe<capnp::Capability::Client> * __thiscall
capnp::_::anon_unknown_0::MembranePolicyImpl::inboundCall
          (Maybe<capnp::Capability::Client> *__return_storage_ptr__,MembranePolicyImpl *this,
          uint64_t interfaceId,uint16_t methodId,Client target)

{
  undefined2 in_register_0000000a;
  Own<capnp::_::(anonymous_namespace)::ThingImpl> OStack_38;
  Own<capnp::ClientHook> local_28;
  
  if (CONCAT22(in_register_0000000a,methodId) == 1 && interfaceId == 0x9352e4e41f173917) {
    kj::heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[8]>
              ((kj *)&OStack_38,(char (*) [8])"inbound");
    Capability::Client::Client<capnp::_::(anonymous_namespace)::ThingImpl,void>
              ((Client *)&local_28,&OStack_38);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.hook.disposer = local_28.disposer;
    (__return_storage_ptr__->ptr).field_1.value.hook.ptr = local_28.ptr;
    local_28.ptr = (ClientHook *)0x0;
    kj::Own<capnp::ClientHook>::dispose(&local_28);
    kj::Own<capnp::_::(anonymous_namespace)::ThingImpl>::~Own(&OStack_38);
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Capability::Client> inboundCall(uint64_t interfaceId, uint16_t methodId,
                                            Capability::Client target) override {
    if (interfaceId == capnp::typeId<Thing>() && methodId == 1) {
      return Capability::Client(kj::heap<ThingImpl>("inbound"));
    } else {
      return nullptr;
    }
  }